

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O1

size_t luaZ_read(ZIO *z,void *b,size_t n)

{
  int iVar1;
  size_t unaff_R12;
  size_t sVar2;
  ulong __n;
  
  do {
    if (n == 0) {
      return 0;
    }
    iVar1 = checkbuffer(z);
    sVar2 = n;
    if (iVar1 != 0) {
      __n = z->n;
      if (n < z->n) {
        __n = n;
      }
      memcpy(b,z->p,__n);
      z->n = z->n - __n;
      z->p = z->p + __n;
      b = (void *)((long)b + __n);
      n = n - __n;
      sVar2 = unaff_R12;
    }
    unaff_R12 = sVar2;
  } while (iVar1 != 0);
  return sVar2;
}

Assistant:

size_t luaZ_read (ZIO *z, void *b, size_t n) {
  while (n) {
    size_t m;
    if (!checkbuffer(z))
      return n;  /* no more input; return number of missing bytes */
    m = (n <= z->n) ? n : z->n;  /* min. between n and z->n */
    memcpy(b, z->p, m);
    z->n -= m;
    z->p += m;
    b = (char *)b + m;
    n -= m;
  }
  return 0;
}